

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_fluidsynth_mididevice.cpp
# Opt level: O3

void __thiscall
FluidSynthMIDIDevice::FluidSettingInt(FluidSynthMIDIDevice *this,char *setting,int value)

{
  fluid_synth_t *pfVar1;
  fluid_settings_t *pfVar2;
  code *UNRECOVERED_JUMPTABLE;
  int iVar3;
  char *pcVar4;
  
  pfVar1 = this->FluidSynth;
  if ((pfVar1 == (fluid_synth_t *)0x0) ||
     (pfVar2 = this->FluidSettings, pfVar2 == (fluid_settings_t *)0x0)) {
    return;
  }
  iVar3 = strcmp(setting,"synth.interpolation");
  if (iVar3 == 0) {
    if (FluidSynthModule.handle != (void *)0x0) {
      iVar3 = (*(code *)fluid_synth_set_interp_method.proc.Call)(pfVar1,0xffffffff,value);
      if (iVar3 == 0) {
        return;
      }
      pcVar4 = "Setting interpolation method %d failed.\n";
LAB_00340eb2:
      Printf(pcVar4,(ulong)(uint)value);
      return;
    }
    pcVar4 = 
    "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, int, int)>::operator int (*)(fluid_synth_t *, int, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, int, int)]"
    ;
  }
  else {
    iVar3 = strcmp(setting,"synth.polyphony");
    if (iVar3 == 0) {
      if (FluidSynthModule.handle != (void *)0x0) {
        iVar3 = (*(code *)fluid_synth_set_polyphony.proc.Call)(pfVar1,value);
        if (iVar3 == 0) {
          return;
        }
        pcVar4 = "Setting polyphony to %d failed.\n";
        goto LAB_00340eb2;
      }
      pcVar4 = 
      "Proto TReqProc<FluidSynthModule, int (*)(fluid_synth_t *, int)>::operator int (*)(fluid_synth_t *, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_synth_t *, int)]"
      ;
    }
    else {
      iVar3 = strcmp(setting,"z.reverb-changed");
      if (iVar3 == 0) {
        if (FluidSynthModule.handle != (void *)0x0) {
          (*(code *)fluid_synth_set_reverb.proc.Call)
                    ((double)fluid_reverb_roomsize.Value,(double)fluid_reverb_damping.Value,
                     (double)fluid_reverb_width.Value,(double)fluid_reverb_level.Value,pfVar1);
          return;
        }
        pcVar4 = 
        "Proto TReqProc<FluidSynthModule, void (*)(fluid_synth_t *, double, double, double, double)>::operator void (*)(fluid_synth_t *, double, double, double, double)() const [Module = FluidSynthModule, Proto = void (*)(fluid_synth_t *, double, double, double, double)]"
        ;
      }
      else {
        iVar3 = strcmp(setting,"z.chorus-changed");
        if (iVar3 == 0) {
          if (FluidSynthModule.handle != (void *)0x0) {
            (*(code *)fluid_synth_set_chorus.proc.Call)
                      ((double)fluid_chorus_level.Value,(double)fluid_chorus_speed.Value,
                       (double)fluid_chorus_depth.Value,pfVar1,fluid_chorus_voices.Value,
                       fluid_chorus_type.Value);
            return;
          }
          pcVar4 = 
          "Proto TReqProc<FluidSynthModule, void (*)(fluid_synth_t *, int, double, double, double, int)>::operator void (*)(fluid_synth_t *, int, double, double, double, int)() const [Module = FluidSynthModule, Proto = void (*)(fluid_synth_t *, int, double, double, double, int)]"
          ;
        }
        else if (FluidSynthModule.handle == (void *)0x0) {
          pcVar4 = 
          "Proto TReqProc<FluidSynthModule, int (*)(fluid_settings_t *, const char *, int)>::operator int (*)(fluid_settings_t *, const char *, int)() const [Module = FluidSynthModule, Proto = int (*)(fluid_settings_t *, const char *, int)]"
          ;
        }
        else {
          iVar3 = (*(code *)fluid_settings_setint.proc.Call)(pfVar2,setting,value);
          if (iVar3 == 0) {
            Printf("Failed to set %s to %d.\n",setting,(ulong)(uint)value);
            return;
          }
          iVar3 = strcmp(setting,"synth.reverb.active");
          UNRECOVERED_JUMPTABLE = (code *)fluid_synth_set_reverb_on.proc.Call;
          if ((iVar3 != 0) &&
             (iVar3 = strcmp(setting,"synth.chorus.active"),
             UNRECOVERED_JUMPTABLE = (code *)fluid_synth_set_chorus_on.proc.Call, iVar3 != 0)) {
            return;
          }
          if (FluidSynthModule.handle != (void *)0x0) {
            (*UNRECOVERED_JUMPTABLE)(this->FluidSynth,value);
            return;
          }
          pcVar4 = 
          "Proto TReqProc<FluidSynthModule, void (*)(fluid_synth_t *, int)>::operator void (*)(fluid_synth_t *, int)() const [Module = FluidSynthModule, Proto = void (*)(fluid_synth_t *, int)]"
          ;
          FluidSynthModule.handle = (void *)0x0;
        }
      }
    }
  }
  __assert_fail("Module.IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./i_module.h"
                ,0xd2,pcVar4);
}

Assistant:

void FluidSynthMIDIDevice::FluidSettingInt(const char *setting, int value)
{
	if (FluidSynth == NULL || FluidSettings == NULL)
	{
		return;
	}

	if (strcmp(setting, "synth.interpolation") == 0)
	{
		if (FLUID_OK != fluid_synth_set_interp_method(FluidSynth, -1, value))
		{
			Printf("Setting interpolation method %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "synth.polyphony") == 0)
	{
		if (FLUID_OK != fluid_synth_set_polyphony(FluidSynth, value))
		{
			Printf("Setting polyphony to %d failed.\n", value);
		}
	}
	else if (strcmp(setting, "z.reverb-changed") == 0)
	{
		fluid_synth_set_reverb(FluidSynth, fluid_reverb_roomsize, fluid_reverb_damping,
			fluid_reverb_width, fluid_reverb_level);
	}
	else if (strcmp(setting, "z.chorus-changed") == 0)
	{
		fluid_synth_set_chorus(FluidSynth, fluid_chorus_voices, fluid_chorus_level,
			fluid_chorus_speed, fluid_chorus_depth, fluid_chorus_type);
	}
	else if (0 == fluid_settings_setint(FluidSettings, setting, value))
	{
		Printf("Failed to set %s to %d.\n", setting, value);
	}
	// fluid_settings_setint succeeded; update these settings in the running synth, too
	else if (strcmp(setting, "synth.reverb.active") == 0)
	{
		fluid_synth_set_reverb_on(FluidSynth, value);
	}
	else if (strcmp(setting, "synth.chorus.active") == 0)
	{
		fluid_synth_set_chorus_on(FluidSynth, value);
	}
}